

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfx.cpp
# Opt level: O0

Stream * rw::readMaterialMatFX(Stream *stream,int32 param_2,void *object,int32 offset,int32 param_5)

{
  FILE *pFVar1;
  bool bVar2;
  uint32 uVar3;
  int32 iVar4;
  int32 iVar5;
  int32 iVar6;
  MatFX *this;
  char *pcVar7;
  float32 fVar8;
  Error local_8c;
  Error _e_3;
  Error _e_2;
  Error _e_1;
  Error _e;
  uint32 type;
  int i;
  int32 idx;
  int32 dstBlend;
  int32 srcBlend;
  int32 fbAlpha;
  float coefficient;
  Texture *bumpedTex;
  Texture *tex;
  MatFX *matfx;
  Material *mat;
  int32 param_4_local;
  int32 offset_local;
  void *object_local;
  int32 param_1_local;
  Stream *stream_local;
  
  uVar3 = Stream::readU32(stream);
  MatFX::setEffects((Material *)object,uVar3);
  this = MatFX::get((Material *)object);
  _e.code = 0;
  do {
    if (1 < (int)_e.code) {
      return stream;
    }
    uVar3 = Stream::readU32(stream);
    if (uVar3 == 1) {
      fVar8 = Stream::readF32(stream);
      bumpedTex = (Texture *)0x0;
      _fbAlpha = (Texture *)0x0;
      iVar4 = Stream::readI32(stream);
      if (iVar4 != 0) {
        bVar2 = findChunk(stream,6,(uint32 *)0x0,(uint32 *)0x0);
        if (!bVar2) {
          _e_1.plugin = 0x120;
          _e_1.code = 0x80000004;
          fprintf(_stderr,"%s:%d: ",
                  "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/matfx.cpp",
                  0x1ad);
          pFVar1 = _stderr;
          pcVar7 = dbgsprint(0x80000004,"TEXTURE");
          fprintf(pFVar1,"%s\n",pcVar7);
          setError(&_e_1);
          return (Stream *)0x0;
        }
        _fbAlpha = Texture::streamRead(stream);
      }
      iVar4 = Stream::readI32(stream);
      if (iVar4 != 0) {
        bVar2 = findChunk(stream,6,(uint32 *)0x0,(uint32 *)0x0);
        if (!bVar2) {
          _e_2.plugin = 0x120;
          _e_2.code = 0x80000004;
          fprintf(_stderr,"%s:%d: ",
                  "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/matfx.cpp",
                  0x1b5);
          pFVar1 = _stderr;
          pcVar7 = dbgsprint(0x80000004,"TEXTURE");
          fprintf(pFVar1,"%s\n",pcVar7);
          setError(&_e_2);
          return (Stream *)0x0;
        }
        bumpedTex = Texture::streamRead(stream);
      }
      iVar4 = MatFX::getEffectIndex(this,1);
      this->fx[iVar4].field_1.bump.bumpedTex = _fbAlpha;
      this->fx[iVar4].field_1.bump.tex = bumpedTex;
      this->fx[iVar4].field_1.bump.coefficient = (float)fVar8;
    }
    else if (uVar3 == 2) {
      fVar8 = Stream::readF32(stream);
      iVar4 = Stream::readI32(stream);
      bumpedTex = (Texture *)0x0;
      iVar5 = Stream::readI32(stream);
      if (iVar5 != 0) {
        bVar2 = findChunk(stream,6,(uint32 *)0x0,(uint32 *)0x0);
        if (!bVar2) {
          _e_3.plugin = 0x120;
          _e_3.code = 0x80000004;
          fprintf(_stderr,"%s:%d: ",
                  "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/matfx.cpp",
                  0x1c8);
          pFVar1 = _stderr;
          pcVar7 = dbgsprint(0x80000004,"TEXTURE");
          fprintf(pFVar1,"%s\n",pcVar7);
          setError(&_e_3);
          return (Stream *)0x0;
        }
        bumpedTex = Texture::streamRead(stream);
      }
      iVar5 = MatFX::getEffectIndex(this,2);
      this->fx[iVar5].field_1.bump.bumpedTex = bumpedTex;
      this->fx[iVar5].field_1.env.fbAlpha = iVar4;
      this->fx[iVar5].field_1.env.coefficient = (float)fVar8;
    }
    else if (uVar3 == 4) {
      iVar4 = Stream::readI32(stream);
      iVar5 = Stream::readI32(stream);
      bumpedTex = (Texture *)0x0;
      iVar6 = Stream::readI32(stream);
      if (iVar6 != 0) {
        bVar2 = findChunk(stream,6,(uint32 *)0x0,(uint32 *)0x0);
        if (!bVar2) {
          local_8c.plugin = 0x120;
          local_8c.code = 0x80000004;
          fprintf(_stderr,"%s:%d: ",
                  "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/matfx.cpp",
                  0x1db);
          pFVar1 = _stderr;
          pcVar7 = dbgsprint(0x80000004,"TEXTURE");
          fprintf(pFVar1,"%s\n",pcVar7);
          setError(&local_8c);
          return (Stream *)0x0;
        }
        bumpedTex = Texture::streamRead(stream);
      }
      iVar6 = MatFX::getEffectIndex(this,4);
      this->fx[iVar6].field_1.dual.tex = bumpedTex;
      this->fx[iVar6].field_1.dual.srcBlend = iVar4;
      this->fx[iVar6].field_1.dual.dstBlend = iVar5;
    }
    _e.code = _e.code + 1;
  } while( true );
}

Assistant:

static Stream*
readMaterialMatFX(Stream *stream, int32, void *object, int32 offset, int32)
{
	Material *mat;
	MatFX *matfx;
	Texture *tex, *bumpedTex;
	float coefficient;
	int32 fbAlpha;
	int32 srcBlend, dstBlend;
	int32 idx;

	mat = (Material*)object;
	MatFX::setEffects(mat, stream->readU32());
	matfx = MatFX::get(mat);

	for(int i = 0; i < 2; i++){
		uint32 type = stream->readU32();
		switch(type){
		case MatFX::BUMPMAP:
			coefficient = stream->readF32();
			bumpedTex = tex = nil;
			if(stream->readI32()){
				if(!findChunk(stream, ID_TEXTURE,
				              nil, nil)){
					RWERROR((ERR_CHUNK, "TEXTURE"));
					return nil;
				}
				bumpedTex = Texture::streamRead(stream);
			}
			if(stream->readI32()){
				if(!findChunk(stream, ID_TEXTURE,
				              nil, nil)){
					RWERROR((ERR_CHUNK, "TEXTURE"));
					return nil;
				}
				tex = Texture::streamRead(stream);
			}
			idx = matfx->getEffectIndex(type);
			assert(idx >= 0);
			matfx->fx[idx].bump.bumpedTex = bumpedTex;
			matfx->fx[idx].bump.tex = tex;
			matfx->fx[idx].bump.coefficient = coefficient;
			break;

		case MatFX::ENVMAP:
			coefficient = stream->readF32();
			fbAlpha = stream->readI32();
			tex = nil;
			if(stream->readI32()){
				if(!findChunk(stream, ID_TEXTURE,
				              nil, nil)){
					RWERROR((ERR_CHUNK, "TEXTURE"));
					return nil;
				}
				tex = Texture::streamRead(stream);
			}
			idx = matfx->getEffectIndex(type);
			assert(idx >= 0);
			matfx->fx[idx].env.tex = tex;
			matfx->fx[idx].env.fbAlpha = fbAlpha;
			matfx->fx[idx].env.coefficient = coefficient;
			break;

		case MatFX::DUAL:
			srcBlend = stream->readI32();
			dstBlend = stream->readI32();
			tex = nil;
			if(stream->readI32()){
				if(!findChunk(stream, ID_TEXTURE,
				              nil, nil)){
					RWERROR((ERR_CHUNK, "TEXTURE"));
					return nil;
				}
				tex = Texture::streamRead(stream);
			}
			idx = matfx->getEffectIndex(type);
			assert(idx >= 0);
			matfx->fx[idx].dual.tex = tex;
			matfx->fx[idx].dual.srcBlend = srcBlend;
			matfx->fx[idx].dual.dstBlend = dstBlend;
			break;
		}
	}
	return stream;
}